

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.hpp
# Opt level: O0

vector<unsigned_short,_std::allocator<unsigned_short>_> *
alphabet_mapping_tbl<unsigned_long>
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *global_hist)

{
  const_reference pvVar1;
  reference pvVar2;
  ulong local_38;
  size_t c;
  uint16_t next;
  allocator<unsigned_short> local_1d;
  value_type_conflict2 local_1c;
  undefined1 local_19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *global_hist_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *mapping;
  
  local_19 = 0;
  local_1c = 0;
  local_18 = global_hist;
  global_hist_local =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__;
  std::allocator<unsigned_short>::allocator(&local_1d);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (__return_storage_ptr__,0x100,&local_1c,&local_1d);
  std::allocator<unsigned_short>::~allocator(&local_1d);
  c._2_2_ = 1;
  for (local_38 = 0; local_38 < 0x100; local_38 = local_38 + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_18,local_38);
    if (*pvVar1 != 0) {
      pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (__return_storage_ptr__,local_38);
      *pvVar2 = c._2_2_;
      c._2_2_ = c._2_2_ + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint16_t> alphabet_mapping_tbl(const std::vector<index_t>& global_hist) {
    std::vector<uint16_t> mapping(256, 0);

    uint16_t next = static_cast<uint16_t>(1);
    for (std::size_t c = 0; c < 256; ++c) {
        if (global_hist[c] != 0) {
            mapping[c] = next;
            ++next;
        }
    }
    return mapping;
}